

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

void __thiscall QNetworkRequest::QNetworkRequest(QNetworkRequest *this)

{
  QNetworkRequestPrivate *pQVar1;
  
  pQVar1 = (QNetworkRequestPrivate *)operator_new(0xa8);
  QNetworkRequestPrivate::QNetworkRequestPrivate(pQVar1);
  (this->d).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  pQVar1 = QSharedDataPointer<QNetworkRequestPrivate>::operator->(&this->d);
  QHttp2Configuration::setStreamReceiveWindowSize(&pQVar1->h2Configuration,0xccccccc);
  pQVar1 = QSharedDataPointer<QNetworkRequestPrivate>::operator->(&this->d);
  QHttp2Configuration::setSessionReceiveWindowSize(&pQVar1->h2Configuration,0x7fffffff);
  pQVar1 = QSharedDataPointer<QNetworkRequestPrivate>::operator->(&this->d);
  QHttp2Configuration::setServerPushEnabled(&pQVar1->h2Configuration,false);
  return;
}

Assistant:

QNetworkRequest::QNetworkRequest()
    : d(new QNetworkRequestPrivate)
{
#if QT_CONFIG(http)
    // Initial values proposed by RFC 7540 are quite draconian, but we
    // know about servers configured with this value as maximum possible,
    // rejecting our SETTINGS frame and sending us a GOAWAY frame with the
    // flow control error set. If this causes a problem - the app should
    // set a proper configuration. We'll use our defaults, as documented.
    d->h2Configuration.setStreamReceiveWindowSize(Http2::qtDefaultStreamReceiveWindowSize);
    d->h2Configuration.setSessionReceiveWindowSize(Http2::maxSessionReceiveWindowSize);
    d->h2Configuration.setServerPushEnabled(false);
#endif // QT_CONFIG(http)
}